

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cc
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
event::as_stream(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                event *this)

{
  uint32_t __hostlong;
  uint8_t (*pauVar1) [4];
  uint8_t (*bytes) [1];
  uchar *buf;
  size_type sVar2;
  uint32_t local_80;
  uint32_t local_7c;
  iterator iStack_78;
  uint32_t crc;
  uchar *local_70;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  const_iterator local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *aux_data;
  uint32_t local_20;
  byte local_19;
  event *local_18;
  event *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *stream;
  
  local_19 = 0;
  local_18 = this;
  this_local = (event *)__return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  __hostlong = (*this->_vptr_event[2])();
  local_20 = htonl(__hostlong);
  pauVar1 = anon_unknown.dwarf_197ce::as_bytes<unsigned_int>(&local_20);
  (anonymous_namespace)::append_bytes<unsigned_char_const(*)[4]>
            (__return_storage_ptr__,(uchar (*) [4])pauVar1);
  bytes = anon_unknown.dwarf_197ce::as_bytes<event_type_t>(&this->event_type);
  (anonymous_namespace)::append_bytes<unsigned_char_const(*)[1]>
            (__return_storage_ptr__,(uchar (*) [1])bytes);
  aux_data._0_4_ = htonl(this->event_no);
  pauVar1 = anon_unknown.dwarf_197ce::as_bytes<unsigned_int>((uint *)&aux_data);
  (anonymous_namespace)::append_bytes<unsigned_char_const(*)[4]>
            (__return_storage_ptr__,(uchar (*) [4])pauVar1);
  (*this->_vptr_event[4])(&local_50);
  local_38 = &local_50;
  local_60._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                          (__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_58,&local_60);
  local_68._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_38);
  local_70 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(local_38);
  iStack_78 = std::vector<unsigned_char,std::allocator<unsigned_char>>::
              insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         __return_storage_ptr__,local_58,local_68,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_70);
  buf = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(__return_storage_ptr__);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(__return_storage_ptr__);
  local_7c = xcrc32(buf,(int)sVar2,0);
  local_80 = htonl(local_7c);
  pauVar1 = anon_unknown.dwarf_197ce::as_bytes<unsigned_int>(&local_80);
  (anonymous_namespace)::append_bytes<unsigned_char_const(*)[4]>
            (__return_storage_ptr__,(uchar (*) [4])pauVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::shrink_to_fit(__return_storage_ptr__);
  local_19 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_50);
  if ((local_19 & 1) == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint8_t> event::as_stream() const
{
	std::vector<std::uint8_t> stream;

	append_bytes(stream, as_bytes(htonl(calculate_len())));
	append_bytes(stream, as_bytes(event_type));
	append_bytes(stream, as_bytes(htonl(event_no)));

	const auto& aux_data = aux_as_stream();
	stream.insert(stream.end(), aux_data.begin(), aux_data.end());

	auto crc =	xcrc32(stream.data(), stream.size(), 0);
	append_bytes(stream, as_bytes(htonl(crc)));

	stream.shrink_to_fit();
	return stream;
}